

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int ctx_get(nng_ctx id,char *n,void *v,size_t *szp,nni_type t)

{
  int iVar1;
  nni_ctx *local_30;
  nni_ctx *ctx;
  
  iVar1 = nni_ctx_find(&local_30,id.id);
  if (iVar1 == 0) {
    iVar1 = nni_ctx_getopt(local_30,n,v,(size_t *)0x0,(nni_type)szp);
    nni_ctx_rele(local_30);
  }
  return iVar1;
}

Assistant:

static int
ctx_get(nng_ctx id, const char *n, void *v, size_t *szp, nni_type t)
{
	nni_ctx *ctx;
	int      rv;

	if ((rv = nni_ctx_find(&ctx, id.id)) != 0) {
		return (rv);
	}
	rv = nni_ctx_getopt(ctx, n, v, szp, t);
	nni_ctx_rele(ctx);
	return (rv);
}